

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O0

char * conv_path_to_utf8_with_tmpl
                 (GString *path,char *from_enc,out_fmt fmt_type,StrTransformFunc func,GError **error
                 )

{
  gsize gVar1;
  gsize gVar2;
  gsize gVar3;
  GQuark GVar4;
  int iVar5;
  undefined8 uVar6;
  long *plVar7;
  int *piVar8;
  long *plVar9;
  undefined8 uVar10;
  char *local_c0;
  ulong local_b8;
  size_t i;
  GString *dbg_str;
  char *old;
  size_t *processed;
  GString *pGStack_90;
  int e;
  GString *s;
  GPtrArray *err_offsets;
  GIConv conv;
  gsize status;
  gsize char_sz;
  gsize o_left;
  gsize i_left;
  gsize i_size;
  char *result;
  char *o_ptr;
  char *i_ptr;
  GError **error_local;
  StrTransformFunc func_local;
  char *pcStack_20;
  out_fmt fmt_type_local;
  char *from_enc_local;
  GString *path_local;
  
  i_ptr = (char *)error;
  error_local = (GError **)func;
  func_local._4_4_ = fmt_type;
  pcStack_20 = from_enc;
  from_enc_local = (char *)path;
  if (path == (GString *)0x0) {
    g_return_if_fail_warning("rifiuti2","conv_path_to_utf8_with_tmpl","path != NULL");
    path_local = (GString *)0x0;
  }
  else if ((from_enc == (char *)0x0) || (*from_enc != '\0')) {
    if (from_enc == (char *)0x0) {
      status = 2;
      i_left = ucs2_bytelen(path->str,path->len);
    }
    else {
      status = 1;
      i_left = strnlen(path->str,0x104);
    }
    o_ptr = *(char **)from_enc_local;
    o_left = i_left;
    pGStack_90 = (GString *)g_string_sized_new(i_left + 1);
    _sync_pos(pGStack_90,&char_sz,&result,true);
    if (pcStack_20 == (char *)0x0) {
      local_c0 = "UTF-16LE";
    }
    else {
      local_c0 = pcStack_20;
    }
    uVar6 = g_iconv_open("UTF-8",local_c0);
    g_log("rifiuti2",0x80,"Initial : r=%02zu, w=%02zu/%02zu",o_left,char_sz,
          pGStack_90->allocated_len - 1);
    plVar7 = (long *)g_ptr_array_new_with_free_func(g_free);
    while ((o_left != 0 && ((*o_ptr != '\0' || ((pcStack_20 == (char *)0x0 && (o_ptr[1] != '\0')))))
           )) {
      conv = (GIConv)g_iconv(uVar6,&o_ptr,&o_left,&result,&char_sz);
      _sync_pos(pGStack_90,&char_sz,&result,false);
      if (conv != (GIConv)0xffffffffffffffff) break;
      piVar8 = __errno_location();
      gVar3 = o_left;
      gVar2 = char_sz;
      iVar5 = *piVar8;
      gVar1 = pGStack_90->allocated_len;
      uVar10 = g_strerror(iVar5);
      g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",gVar3,gVar2,
            gVar1 - 1,0xffffffffffffffff,uVar10,pGStack_90->str);
      if (iVar5 == 7) {
        pGStack_90 = (GString *)g_string_set_size(pGStack_90,pGStack_90->allocated_len << 1);
        _sync_pos(pGStack_90,&char_sz,&result,true);
      }
      else if ((iVar5 == 0x16) || (iVar5 == 0x54)) {
        plVar9 = (long *)g_malloc(8);
        *plVar9 = i_left - o_left;
        g_ptr_array_add(plVar7,plVar9);
        _advance_octet(status,&o_ptr,&o_left,pGStack_90,func_local._4_4_);
        _sync_pos(pGStack_90,&char_sz,&result,true);
        g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, str=%s",o_left,char_sz,
              pGStack_90->allocated_len - 1,pGStack_90->str);
        g_iconv(uVar6,0,0,&result,&char_sz);
        _sync_pos(pGStack_90,&char_sz,&result,false);
      }
    }
    g_log("rifiuti2",0x80,"Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",o_left,char_sz,
          pGStack_90->allocated_len - 1,conv,pGStack_90->str);
    g_iconv_close(uVar6);
    if (i_ptr != (char *)0x0) {
      uVar6 = *(undefined8 *)i_ptr;
      GVar4 = rifiuti_record_error_quark();
      iVar5 = g_error_matches(uVar6,GVar4,3);
      if ((iVar5 != 0) && ((int)plVar7[1] != 0)) {
        uVar6 = *(undefined8 *)(*(long *)i_ptr + 8);
        uVar10 = g_string_new(uVar6);
        uVar10 = g_string_append(uVar10,", at offset:");
        for (local_b8 = 0; local_b8 < *(uint *)(plVar7 + 1); local_b8 = local_b8 + 1) {
          g_string_append_printf(uVar10," %zu",**(undefined8 **)(*plVar7 + local_b8 * 8));
        }
        uVar10 = g_string_free(uVar10,0);
        *(undefined8 *)(*(long *)i_ptr + 8) = uVar10;
        g_free(uVar6);
      }
    }
    g_ptr_array_free(plVar7,1);
    iVar5 = g_utf8_validate(pGStack_90->str,0xffffffffffffffff,0);
    if (iVar5 == 0) {
      g_return_if_fail_warning
                ("rifiuti2","conv_path_to_utf8_with_tmpl","g_utf8_validate (s->str, -1, NULL)");
      path_local = (GString *)0x0;
    }
    else {
      if (error_local == (GError **)0x0) {
        i_size = (gsize)_filter_printable_char(pGStack_90->str,func_local._4_4_);
      }
      else {
        i_size = (*(code *)error_local)(pGStack_90->str);
      }
      g_string_free(pGStack_90,1);
      path_local = (GString *)i_size;
    }
  }
  else {
    g_return_if_fail_warning("rifiuti2","conv_path_to_utf8_with_tmpl","! from_enc || *from_enc");
    path_local = (GString *)0x0;
  }
  return (char *)path_local;
}

Assistant:

char *
conv_path_to_utf8_with_tmpl (const GString   *path,
                             const char      *from_enc,
                             out_fmt          fmt_type,
                             StrTransformFunc func,
                             GError         **error)
{
    char            *i_ptr,
                    *o_ptr,
                    *result;
    gsize            i_size,
                     i_left,
                     o_left,
                     char_sz,
                     status;
    GIConv           conv;
    GPtrArray       *err_offsets;
    GString         *s;

    // For unicode path, the first char must be ASCII drive letter
    // or slash. And since it is in little endian, first byte is
    // always non-null
    g_return_val_if_fail (path != NULL, NULL);
    g_return_val_if_fail (! from_enc || *from_enc, NULL);

    if (from_enc)
    {
        char_sz = sizeof (char);
        i_left = i_size = strnlen (path->str, WIN_PATH_MAX);
    }
    else
    {
        char_sz = sizeof (gunichar2);
        i_left = i_size = ucs2_bytelen (path->str, path->len);
    }
    i_ptr = path->str;

    // Ballpark figure, GString decides alloc size on its own
    s = g_string_sized_new (i_size + 1);
    _sync_pos (s, &o_left, &o_ptr, true);

    // Shouldn't fail, encoding already tested upon start of prog
    conv = g_iconv_open ("UTF-8", from_enc ? from_enc : "UTF-16LE");

    g_debug ("Initial : r=%02zu, w=%02zu/%02zu",
        i_left, o_left, s->allocated_len - 1);
    err_offsets = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    // Pass 1: Convert to UTF-8, all illegal seq become escaped hex

    while (i_left > 0)
    {
        if (*i_ptr == '\0') {
            if (from_enc   != NULL) break;
            if (*(i_ptr+1) == '\0') break; /* utf-16: check "\0\0" */
        }

        // When non-reversible char are converted to \uFFFD, there
        // is nothing we can do. Just accept the status quo.
        status = g_iconv (conv, &i_ptr, &i_left, &o_ptr, &o_left);
        _sync_pos (s, &o_left, &o_ptr, false);
        if (status != (gsize) -1)
            break;

        int e = errno;
        g_debug ("Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",
            i_left, o_left, s->allocated_len - 1,
            status, g_strerror(e), s->str);

        switch (e)
        {
        case EINVAL:
        case EILSEQ:
        {
            size_t *processed = g_malloc (sizeof (size_t));
            *processed = i_size - i_left;
            g_ptr_array_add (err_offsets, processed);
        }
            _advance_octet (char_sz, &i_ptr, &i_left, s, fmt_type);
            _sync_pos (s, &o_left, &o_ptr, true);
            g_debug ("Progress: r=%02zu, w=%02zu/%02zu, str=%s",
                i_left, o_left, s->allocated_len - 1, s->str);
            g_iconv (conv, NULL, NULL, &o_ptr, &o_left);  // reset state
            _sync_pos (s, &o_left, &o_ptr, false);
            break;
        case E2BIG:
            s = g_string_set_size (s, s->allocated_len * 2);
            _sync_pos (s, &o_left, &o_ptr, true);
            break;
        }
    }

    g_debug ("Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",
        i_left, o_left, s->allocated_len - 1, status, s->str);

    g_iconv_close (conv);

    if (error &&
        g_error_matches ((const GError *) (*error),
            R2_REC_ERROR, R2_REC_ERROR_CONV_PATH) &&
        err_offsets->len > 0)
    {
        // More detailed error message showing offsets
        char *old = (*error)->message;
        GString *dbg_str = g_string_new ((const char *) old);
        dbg_str = g_string_append (dbg_str, ", at offset:");
        for (size_t i = 0; i < err_offsets->len; i++)
        {
            g_string_append_printf (dbg_str, " %zu",
                *((size_t *) (err_offsets->pdata[i])));
        }
        (*error)->message = g_string_free (dbg_str, FALSE);
        g_free (old);
    }

    g_ptr_array_free (err_offsets, TRUE);

    // Pass 2: Post processing, e.g. convert non-printable chars to hex

    g_return_val_if_fail (g_utf8_validate (s->str, -1, NULL), NULL);

    if (func == NULL)
        result = _filter_printable_char (s->str, fmt_type);
    else
        result = func (s->str);
    g_string_free (s, TRUE);

    return result;
}